

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  bool bVar3;
  undefined4 local_1c;
  int value;
  char *c_local;
  stbi__context *s_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = stbi__at_eof(s);
    bVar3 = false;
    if (iVar2 == 0) {
      iVar2 = stbi__pnm_isdigit(*c);
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    local_1c = local_1c * 10 + *c + -0x30;
    sVar1 = stbi__get8(s);
    *c = sVar1;
  }
  return local_1c;
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
   }

   return value;
}